

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void test(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int32_t iVar6;
  ulong uVar7;
  ostream *poVar8;
  uint i;
  string *psVar9;
  pointer pbVar10;
  double dVar11;
  int32_t local_324;
  real local_320;
  allocator local_319;
  shared_ptr<const_fasttext::Dictionary> dict;
  Meter meter;
  FastText fasttext;
  ifstream ifs;
  
  bVar3 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1,"test-label");
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (((long)uVar7 >> 5) - 7U < 0xfffffffffffffffd) {
    if (bVar3) {
      printTestLabelUsage();
    }
    else {
      printTestUsage();
    }
LAB_00136985:
    exit(1);
  }
  if ((ulong)((long)uVar7 >> 5) < 5) {
    local_324 = 1;
    pbVar10 = pbVar1;
  }
  else {
    local_324 = std::__cxx11::stoi(pbVar1 + 4,(size_t *)0x0,10);
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10;
  }
  local_320 = 0.0;
  if (0xa0 < uVar7) {
    local_320 = std::__cxx11::stof(pbVar10 + 5,(size_t *)0x0);
  }
  ::fasttext::FastText::FastText(&fasttext);
  ::fasttext::FastText::loadModel(&fasttext,pbVar1 + 2);
  meter.labelMetrics_._M_h._M_buckets = &meter.labelMetrics_._M_h._M_single_bucket;
  meter.metrics_.gold = 0;
  meter.metrics_.predicted = 0;
  meter.metrics_.predictedGold = 0;
  meter.nexamples_ = 0;
  meter.labelMetrics_._M_h._16_16_ = ZEXT416(0) << 0x40;
  meter.labelMetrics_._M_h._M_bucket_count = 1;
  meter.labelMetrics_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  meter.labelMetrics_._M_h._M_rehash_policy._4_4_ = 0;
  meter.labelMetrics_._M_h._40_16_ = meter.labelMetrics_._M_h._16_16_;
  bVar4 = std::operator==(pbVar1 + 3,"-");
  if (bVar4) {
    ::fasttext::FastText::test(&fasttext,(istream *)&std::cin,local_324,local_320,&meter);
  }
  else {
    std::ifstream::ifstream(&ifs,(string *)(pbVar1 + 3),_S_in);
    cVar5 = std::__basic_file<char>::is_open();
    if (cVar5 == '\0') {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Test file cannot be opened!");
      std::endl<char,std::char_traits<char>>(poVar8);
      goto LAB_00136985;
    }
    ::fasttext::FastText::test(&fasttext,(istream *)&ifs,local_324,local_320,&meter);
    std::ifstream::~ifstream(&ifs);
  }
  lVar2 = std::cout;
  if (bVar3) {
    *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 6;
    ::fasttext::FastText::getDictionary((FastText *)&dict);
    i = 0;
    while( true ) {
      iVar6 = ::fasttext::Dictionary::nlabels
                        (dict.
                         super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      if (iVar6 <= (int)i) break;
      std::__cxx11::string::string((string *)&ifs,"F1-Score",&local_319);
      psVar9 = (string *)(ulong)i;
      dVar11 = ::fasttext::Meter::f1Score(&meter,i);
      test::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&ifs,psVar9,dVar11);
      std::__cxx11::string::~string((string *)&ifs);
      std::__cxx11::string::string((string *)&ifs,"Precision",&local_319);
      psVar9 = (string *)(ulong)i;
      dVar11 = ::fasttext::Meter::precision(&meter,i);
      test::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&ifs,psVar9,dVar11);
      std::__cxx11::string::~string((string *)&ifs);
      std::__cxx11::string::string((string *)&ifs,"Recall",&local_319);
      psVar9 = (string *)(ulong)i;
      dVar11 = ::fasttext::Meter::recall(&meter,i);
      test::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&ifs,psVar9,dVar11);
      std::__cxx11::string::~string((string *)&ifs);
      poVar8 = std::operator<<((ostream *)&std::cout," ");
      ::fasttext::Dictionary::getLabel_abi_cxx11_
                ((string *)&ifs,
                 dict.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,i);
      poVar8 = std::operator<<(poVar8,(string *)&ifs);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&ifs);
      i = i + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&dict.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  ::fasttext::Meter::writeGeneralMetrics(&meter,(ostream *)&std::cout,local_324);
  exit(0);
}

Assistant:

void test(const std::vector<std::string>& args) {
  bool perLabel = args[1] == "test-label";

  if (args.size() < 4 || args.size() > 6) {
    perLabel ? printTestLabelUsage() : printTestUsage();
    exit(EXIT_FAILURE);
  }

  const auto& model = args[2];
  const auto& input = args[3];
  int32_t k = args.size() > 4 ? std::stoi(args[4]) : 1;
  real threshold = args.size() > 5 ? std::stof(args[5]) : 0.0;

  FastText fasttext;
  fasttext.loadModel(model);

  Meter meter;

  if (input == "-") {
    fasttext.test(std::cin, k, threshold, meter);
  } else {
    std::ifstream ifs(input);
    if (!ifs.is_open()) {
      std::cerr << "Test file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
    fasttext.test(ifs, k, threshold, meter);
  }

  if (perLabel) {
    std::cout << std::fixed << std::setprecision(6);
    auto writeMetric = [](const std::string& name, double value) {
      std::cout << name << " : ";
      if (std::isfinite(value)) {
        std::cout << value;
      } else {
        std::cout << "--------";
      }
      std::cout << "  ";
    };

    std::shared_ptr<const Dictionary> dict = fasttext.getDictionary();
    for (int32_t labelId = 0; labelId < dict->nlabels(); labelId++) {
      writeMetric("F1-Score", meter.f1Score(labelId));
      writeMetric("Precision", meter.precision(labelId));
      writeMetric("Recall", meter.recall(labelId));
      std::cout << " " << dict->getLabel(labelId) << std::endl;
    }
  }
  meter.writeGeneralMetrics(std::cout, k);

  exit(0);
}